

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequencer.h
# Opt level: O0

unique_ptr<disruptor::SequenceBarrier<disruptor::BlockingStrategy>,_std::default_delete<disruptor::SequenceBarrier<disruptor::BlockingStrategy>_>_>
 __thiscall
disruptor::Sequencer<long,_disruptor::SingleThreadedStrategy,_disruptor::BlockingStrategy,_0>::
NewBarrier(Sequencer<long,_disruptor::SingleThreadedStrategy,_disruptor::BlockingStrategy,_0> *this,
          vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *dependents)

{
  SequenceBarrier<disruptor::BlockingStrategy> *in_RSI;
  _Head_base<0UL,_disruptor::SequenceBarrier<disruptor::BlockingStrategy>_*,_false> in_RDI;
  unique_ptr<disruptor::SequenceBarrier<disruptor::BlockingStrategy>,_std::default_delete<disruptor::SequenceBarrier<disruptor::BlockingStrategy>_>_>
  *sb;
  pointer in_stack_ffffffffffffffa8;
  _Head_base<0UL,_disruptor::SequenceBarrier<disruptor::BlockingStrategy>_*,_false> wait_strategy;
  
  wait_strategy._M_head_impl = in_RDI._M_head_impl;
  operator_new(0x30);
  SequenceBarrier<disruptor::BlockingStrategy>::SequenceBarrier
            (in_RSI,(BlockingStrategy *)wait_strategy._M_head_impl,(Sequence *)in_RDI._M_head_impl,
             (vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *)
             in_stack_ffffffffffffffa8);
  std::
  unique_ptr<disruptor::SequenceBarrier<disruptor::BlockingStrategy>,std::default_delete<disruptor::SequenceBarrier<disruptor::BlockingStrategy>>>
  ::unique_ptr<std::default_delete<disruptor::SequenceBarrier<disruptor::BlockingStrategy>>,void>
            ((unique_ptr<disruptor::SequenceBarrier<disruptor::BlockingStrategy>,_std::default_delete<disruptor::SequenceBarrier<disruptor::BlockingStrategy>_>_>
              *)in_RDI._M_head_impl,in_stack_ffffffffffffffa8);
  return (__uniq_ptr_data<disruptor::SequenceBarrier<disruptor::BlockingStrategy>,_std::default_delete<disruptor::SequenceBarrier<disruptor::BlockingStrategy>_>,_true,_true>
          )(tuple<disruptor::SequenceBarrier<disruptor::BlockingStrategy>_*,_std::default_delete<disruptor::SequenceBarrier<disruptor::BlockingStrategy>_>_>
            )wait_strategy._M_head_impl;
}

Assistant:

std::unique_ptr<SequenceBarrier<W> > NewBarrier(
      const std::vector<Sequence*>& dependents) {
    std::unique_ptr<SequenceBarrier<W> > sb(
        new SequenceBarrier<W>(wait_strategy_, cursor_, dependents));
    return sb;
  }